

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_interactor.cc
# Opt level: O1

int recvall(int s,char *buf,int n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = recv(s,buf,(long)n,0);
  if (0 < n && 0 < (int)uVar1) {
    uVar2 = 0;
    while (uVar2 = (uVar2 & 0xffffffff) + (uVar1 & 0xffffffff), buf[uVar2 - 1] != '\n') {
      uVar1 = recv(s,buf + uVar2,(long)n,0);
      if ((n <= (int)uVar2) || ((int)uVar1 < 1)) break;
    }
  }
  return (int)uVar2;
}

Assistant:

int recvall(int s, char* buf, int n)
{
  int total = 0;
  int ret = recv(s, buf, n, 0);
  while (ret > 0 && total < n)
  {
    total += ret;
    if (buf[total - 1] == '\n')
      break;
    ret = recv(s, buf + total, n, 0);
  }
  return total;
}